

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::auto_managed(torrent *this,bool a)

{
  bool bVar1;
  bool checking_files;
  bool a_local;
  torrent *this_local;
  
  if ((*(uint *)&this->field_0x600 & 1) != (uint)a) {
    bVar1 = should_check_files(this);
    *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0xfffffffe | (uint)a;
    update_gauge(this);
    update_want_scrape(this);
    update_state_list(this);
    state_updated(this);
    set_need_save_resume(this,(resume_data_flags_t)0x20);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c])
              ();
    if ((!bVar1) && (bVar1 = should_check_files(this), bVar1)) {
      start_checking(this);
    }
  }
  return;
}

Assistant:

void torrent::auto_managed(bool a)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_auto_managed == a) return;
		bool const checking_files = should_check_files();
		m_auto_managed = a;
		update_gauge();
		update_want_scrape();
		update_state_list();

		state_updated();

		// we need to save this new state as well
		set_need_save_resume(torrent_handle::if_config_changed);

		// recalculate which torrents should be
		// paused
		m_ses.trigger_auto_manage();

		if (!checking_files && should_check_files())
		{
			start_checking();
		}
	}